

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_impl.cc
# Opt level: O3

TraceImpl * webrtc::TraceImpl::StaticInstance(CountOperation count_operation,TraceLevel level)

{
  CriticalSection *this;
  int iVar1;
  TraceImpl *pTVar2;
  
  if ((count_operation == kAddRefNoCreate && level != kTraceAll) &&
     ((Trace::level_filter_ & level) == kTraceNone)) {
    return (TraceImpl *)0x0;
  }
  if ((GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::crit_sect == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::
                                   crit_sect), iVar1 != 0)) {
    GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::crit_sect =
         &CriticalSectionWrapper::CreateCriticalSection()->lock_;
    __cxa_guard_release(&GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::crit_sect);
  }
  this = GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::crit_sect;
  rtc::CriticalSection::Enter
            (GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::crit_sect);
  pTVar2 = GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::instance;
  if (count_operation == kAddRefNoCreate) {
    if (GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::instance_count != 0) {
LAB_0018e143:
      GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::instance_count =
           GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::instance_count + 1;
      if (GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::instance_count == 1) {
        GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::instance = CreateInstance();
        pTVar2 = GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::instance;
      }
      goto LAB_0018e1bf;
    }
  }
  else {
    if (count_operation - kAddRef < 2) goto LAB_0018e143;
    GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::instance_count =
         GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::instance_count + -1;
    if (GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::instance_count != 0)
    goto LAB_0018e1bf;
    GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::instance = (TraceImpl *)0x0;
    rtc::CriticalSection::Leave
              (GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::crit_sect);
    if (pTVar2 != (TraceImpl *)0x0) {
      (*pTVar2->_vptr_TraceImpl[1])(pTVar2);
    }
    rtc::CriticalSection::Enter
              (GetStaticInstance<webrtc::TraceImpl>(webrtc::CountOperation)::crit_sect);
  }
  pTVar2 = (TraceImpl *)0x0;
LAB_0018e1bf:
  rtc::CriticalSection::Leave(this);
  return pTVar2;
}

Assistant:

TraceImpl* TraceImpl::StaticInstance(CountOperation count_operation,
                                     const TraceLevel level) {
  // Sanities to avoid taking lock unless absolutely necessary (for
  // performance reasons). count_operation == kAddRefNoCreate implies that a
  // message will be written to file.
  if ((level != kTraceAll) && (count_operation == kAddRefNoCreate)) {
    if (!(level & level_filter())) {
      return NULL;
    }
  }
  TraceImpl* impl =
    GetStaticInstance<TraceImpl>(count_operation);
  return impl;
}